

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBufferTextureBufferRange::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  stringstream local_1a8 [8];
  stringstream result;
  ostream local_198;
  FormatInfo *local_20;
  FormatInfo *info_local;
  TextureBufferTextureBufferRange *this_local;
  
  local_20 = info;
  info_local = (FormatInfo *)this;
  this_local = (TextureBufferTextureBufferRange *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,
                  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nvoid main(void)\n{\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getFragmentShaderCode(FormatInfo& info) const
{
	DE_UNREF(info);

	std::stringstream result;

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "void main(void)\n"
			  "{\n"
			  "}\n";

	return result.str();
}